

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O1

void xmlThrDefSetGenericErrorFunc(void *ctx,xmlGenericErrorFunc handler)

{
  xmlMutexLock(xmlThrDefMutex);
  if (handler == (xmlGenericErrorFunc)0x0) {
    handler = xmlGenericErrorDefaultFunc;
  }
  xmlGenericErrorThrDef = handler;
  xmlGenericErrorContextThrDef = ctx;
  xmlMutexUnlock(xmlThrDefMutex);
  return;
}

Assistant:

void
xmlThrDefSetGenericErrorFunc(void *ctx, xmlGenericErrorFunc handler) {
    xmlMutexLock(xmlThrDefMutex);
    xmlGenericErrorContextThrDef = ctx;
    if (handler != NULL)
	xmlGenericErrorThrDef = handler;
    else
	xmlGenericErrorThrDef = xmlGenericErrorDefaultFunc;
    xmlMutexUnlock(xmlThrDefMutex);
}